

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O1

void __thiscall
HighsSparseMatrix::productTransposeQuad
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result_value,
          vector<int,_std::allocator<int>_> *result_index,HVector *column,HighsInt debug_report)

{
  int iVar1;
  pointer piVar2;
  iterator iVar3;
  iterator __position;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  HighsSparseVectorSum report_sum;
  HighsSparseVectorSum local_98;
  double local_68;
  HighsSparseVectorSum local_60;
  
  if (-2 < debug_report) {
    puts("\nHighsSparseMatrix::productTranspose:");
  }
  if (this->format_ == kColwise) {
    std::vector<double,_std::allocator<double>_>::reserve(result_value,(long)this->num_col_);
    std::vector<int,_std::allocator<int>_>::reserve(result_index,(long)this->num_col_);
    local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)((ulong)local_60.values.
                          super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_ << 0x20);
    if (0 < this->num_col_) {
      iVar4 = 0;
      do {
        piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar2[iVar4];
        lVar7 = (long)iVar1;
        iVar4 = piVar2[(long)iVar4 + 1];
        dVar12 = 0.0;
        dVar11 = 0.0;
        if (iVar1 < iVar4) {
          dVar13 = 0.0;
          do {
            dVar14 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start
                     [(this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7]] *
                     (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7];
            dVar12 = dVar13 + dVar14;
            dVar11 = dVar11 + (dVar13 - (dVar12 - dVar14)) + (dVar14 - (dVar12 - (dVar12 - dVar14)))
            ;
            lVar7 = lVar7 + 1;
            dVar13 = dVar12;
          } while (iVar4 != lVar7);
        }
        local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(dVar12 + dVar11);
        if ((double)local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                    _M_impl.super__Vector_impl_data._M_start < 0.0) {
          dVar11 = -dVar11;
        }
        dVar12 = (double)(~-(ulong)((double)local_98.values.
                                            super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                            ._M_impl.super__Vector_impl_data._M_start < 0.0) &
                          (ulong)dVar12 |
                         (ulong)-dVar12 &
                         -(ulong)((double)local_98.values.
                                          super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                                          ._M_impl.super__Vector_impl_data._M_start < 0.0));
        dVar13 = dVar12 + -1e-14;
        if (0.0 < (-1e-14 - (dVar13 - dVar12)) + (dVar12 - (dVar13 - (dVar13 - dVar12))) + dVar11 +
                  dVar13) {
          iVar3._M_current =
               (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (result_value,iVar3,(double *)&local_98);
          }
          else {
            *iVar3._M_current =
                 (double)local_98.values.
                         super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                         super__Vector_impl_data._M_start;
            (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          __position._M_current =
               (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)result_index,__position,(int *)&local_60);
          }
          else {
            *__position._M_current =
                 (int)local_60.values.
                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_start;
            (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        iVar4 = (int)local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1;
        local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(local_60.values.
                               super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,iVar4);
      } while (iVar4 < this->num_col_);
    }
  }
  else {
    HighsSparseVectorSum::HighsSparseVectorSum(&local_98,this->num_col_);
    if (0 < this->num_row_) {
      lVar7 = 0;
      do {
        piVar2 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = piVar2[lVar7];
        lVar8 = (long)iVar4;
        lVar10 = lVar7 + 1;
        if (iVar4 < piVar2[lVar7 + 1]) {
          local_68 = (column->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7];
          do {
            HighsSparseVectorSum::add
                      (&local_98,
                       (this->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8],
                       (this->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar8] * local_68);
            lVar8 = lVar8 + 1;
          } while (lVar8 < (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar10]);
        }
        lVar7 = lVar10;
      } while (lVar10 < this->num_row_);
    }
    if (-2 < debug_report) {
      HighsSparseVectorSum::HighsSparseVectorSum(&local_60,this->num_col_);
      if (0 < this->num_row_) {
        uVar9 = 0;
        do {
          if (debug_report == -1 || (uint)debug_report == uVar9) {
            debugReportRowPrice(this,(HighsInt)uVar9,
                                (column->array).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar9],
                                (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                .super__Vector_impl_data._M_start[uVar9 + 1],&local_60);
          }
          uVar9 = uVar9 + 1;
        } while ((long)uVar9 < (long)this->num_row_);
      }
      if (local_60.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.values.
                        super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    uVar9 = (ulong)((long)local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    uVar5 = (uint)uVar9;
    if (0 < (int)uVar5) {
      lVar7 = (ulong)(uVar5 & 0x7fffffff) + 1;
      do {
        iVar4 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7 + -2];
        if (ABS(local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar4].hi +
                local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar4].lo) <= 1e-14) {
          iVar6 = (int)uVar9;
          uVar9 = (ulong)(iVar6 - 1);
          local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4].hi = 0.0;
          local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
          super__Vector_impl_data._M_start[iVar4].lo = 0.0;
          iVar1 = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)iVar6 + -1];
          local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[(long)iVar6 + -1] = iVar4;
          local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar7 + -2] = iVar1;
        }
        uVar5 = (uint)uVar9;
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
    std::vector<int,_std::allocator<int>_>::resize(&local_98.nonzeroinds,(long)(int)uVar5);
    piVar2 = (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar2 != (pointer)0x0) {
      operator_delete(piVar2);
    }
    uVar5 = (uint)((ulong)((long)(result_index->super__Vector_base<int,_std::allocator<int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(result_index->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 2);
    std::vector<double,_std::allocator<double>_>::reserve(result_value,(long)(int)uVar5);
    if (0 < (int)uVar5) {
      uVar9 = 0;
      do {
        iVar4 = (result_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar9];
        local_60.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)(local_98.values.
                       super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar4].hi +
                      local_98.values.
                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar4].lo);
        iVar3._M_current =
             (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (result_value,iVar3,(double *)&local_60);
        }
        else {
          *iVar3._M_current =
               (double)local_60.values.
                       super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                       super__Vector_impl_data._M_start;
          (result_value->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        uVar9 = uVar9 + 1;
      } while ((uVar5 & 0x7fffffff) != uVar9);
    }
    if (local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_98.values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.values.
                      super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::productTransposeQuad(
    vector<double>& result_value, vector<HighsInt>& result_index,
    const HVector& column, const HighsInt debug_report) const {
  if (debug_report >= kDebugReportAll)
    printf("\nHighsSparseMatrix::productTranspose:\n");
  if (this->isColwise()) {
    result_value.reserve(this->num_col_);
    result_index.reserve(this->num_col_);
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      HighsCDouble value = 0.0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value += column.array[this->index_[iEl]] * this->value_[iEl];

      if (abs(value) - kHighsTiny > 0.0) {
        result_value.push_back(double(value));
        result_index.push_back(iCol);
      }
    }
  } else {
    HighsSparseVectorSum sum(num_col_);
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      double multiplier = column.array[iRow];
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        sum.add(this->index_[iEl], multiplier * this->value_[iEl]);
    }
    if (debug_report >= kDebugReportAll) {
      HighsSparseVectorSum report_sum(num_col_);
      for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
        double multiplier = column.array[iRow];
        if (debug_report == kDebugReportAll || debug_report == iRow)
          debugReportRowPrice(iRow, multiplier, this->start_[iRow + 1],
                              report_sum);
      }
    }

    sum.cleanup([](HighsInt, double x) { return std::abs(x) <= kHighsTiny; });
    result_index = std::move(sum.nonzeroinds);
    HighsInt result_num_nz = result_index.size();
    result_value.reserve(result_num_nz);
    for (HighsInt i = 0; i < result_num_nz; ++i)
      result_value.push_back(sum.getValue(result_index[i]));
  }
}